

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

void rr::(anonymous_namespace)::
     drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *primList,
               VertexPacketAllocator *vpalloc)

{
  TriangleVertex *pTVar1;
  TriangleVertex *pTVar2;
  float fVar3;
  FragmentPacket *pFVar4;
  undefined8 *puVar5;
  undefined4 *puVar6;
  GenericVec4 *pGVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  deUint32 dVar12;
  deUint32 dVar13;
  deUint32 dVar14;
  deUint32 dVar15;
  ClipVolumePlane *pCVar16;
  VertexPacket *pVVar17;
  pointer pTVar18;
  pointer pFVar19;
  pointer pFVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  ClipFloat CVar25;
  double dVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  TriangleVertex *pTVar29;
  TriangleVertex *pTVar30;
  undefined1 auVar31 [16];
  pointer pTVar32;
  double *pdVar33;
  double *pdVar34;
  TextureFormat TVar35;
  ChannelType channelType;
  Vector<float,_2> VVar36;
  Vector<float,_2> outputArray_;
  ClipVolumePlane *pCVar37;
  ClipVolumePlane *pCVar38;
  pointer pFVar39;
  FaceType facetype;
  int iVar40;
  int iVar41;
  int iVar42;
  TextureChannelClass TVar43;
  uint uVar44;
  undefined4 extraout_var;
  long lVar45;
  RasterizationState *pRVar46;
  pointer pTVar47;
  Vector<float,_2> *pVVar48;
  double *pdVar49;
  float afVar50 [2];
  VertexPacket *pVVar51;
  FragmentPacket *fragmentPackets;
  byte bVar52;
  vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_> *pvVar53;
  ulong uVar54;
  pointer pTVar55;
  long lVar56;
  long lVar57;
  double *pdVar58;
  pointer pTVar59;
  ulong uVar60;
  Triangle *__args;
  pointer pTVar61;
  pointer pTVar62;
  ulong uVar63;
  double *pdVar64;
  long lVar65;
  pointer pTVar66;
  Vec4 *v1;
  pointer pTVar67;
  double *pdVar68;
  pointer pVVar69;
  Vec4 *v0;
  double *pdVar70;
  Vec4 *p;
  TriangleVertex *pTVar71;
  long lVar72;
  int i_12;
  SubTriangle *__cur;
  ulong uVar73;
  double *pdVar74;
  byte bVar75;
  _Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  *this;
  long lVar76;
  TriangleVertex *__cur_1;
  TriangleVertex *pTVar77;
  Vector<float,_2> fragmentDepths_;
  bool bVar78;
  bool bVar79;
  uint uVar80;
  deUint32 u32;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined4 extraout_XMM0_Db;
  float fVar85;
  deUint32 u32_1;
  double *pdVar86;
  Vector<float,_2> res_1;
  double *local_338;
  double *local_320;
  Vector<float,_2> res_4;
  undefined1 local_308 [16];
  Vector<float,_2> res_3;
  TextureFormat format;
  vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  convexPrimitive;
  ulong local_268;
  Vector<float,_2> res;
  pointer pFStack_248;
  pointer local_240;
  Vector<float,_2> res_2;
  pointer pGStack_230;
  pointer pGStack_228;
  float local_218 [4];
  undefined1 local_208 [16];
  RasterizationState *local_1f8;
  RasterizationState *local_1f0;
  undefined8 local_1e8;
  ClipVolumePlane *planes [6];
  vector<rr::Fragment,_std::allocator<rr::Fragment>_> local_1a8;
  float local_190 [2];
  bool bStack_17f;
  bool clippedByPlane [6];
  vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> outputTriangles;
  Vector<float,_2> res_5;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  void *local_118;
  ClipFloat CStack_110;
  ClipFloat local_108;
  double local_100;
  double dStack_f8;
  double local_f0;
  double dStack_e8;
  ClipFloat local_e0;
  ClipFloat CStack_d8;
  ClipFloat local_d0;
  double local_c8;
  double dStack_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  ClipFloat local_98;
  FaceType local_88;
  long local_68;
  ComponentPlane<_1,_2> clipNegZ;
  ComponentPlane<1,_2> clipPosZ;
  ComponentPlane<_1,_1> clipNegY;
  ComponentPlane<1,_1> clipPosY;
  ComponentPlane<_1,_0> clipNegX;
  ComponentPlane<1,_0> clipPosX;
  
  pvVar53 = &program->vertexShader->m_outputs;
  if (program->geometryShader != (GeometryShader *)0x0) {
    pvVar53 = &program->geometryShader->m_outputs;
  }
  bVar79 = (state->fragOps).depthClampEnabled;
  pVVar69 = (pvVar53->
            super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((pvVar53->super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar69) {
    uVar60 = 0;
    do {
      if ((pVVar69[uVar60].flatshade == true) &&
         (pTVar66 = (primList->
                    super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl
                    .super__Vector_impl_data._M_start,
         pTVar66 !=
         (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl
         .super__Vector_impl_data._M_finish)) {
        do {
          if (pTVar66->provokingIndex == 2) {
            pTVar59 = (pointer)&pTVar66->v2;
          }
          else {
            pTVar59 = pTVar66;
            if (pTVar66->provokingIndex == 1) {
              pTVar59 = (pointer)&pTVar66->v1;
            }
          }
          pVVar51 = pTVar59->v0;
          dVar12 = pVVar51->outputs[uVar60].v.uData[0];
          dVar13 = pVVar51->outputs[uVar60].v.uData[1];
          dVar14 = pVVar51->outputs[uVar60].v.uData[2];
          dVar15 = pVVar51->outputs[uVar60].v.uData[3];
          pVVar51 = pTVar66->v0;
          pVVar51->outputs[uVar60].v.uData[0] = dVar12;
          pVVar51->outputs[uVar60].v.uData[1] = dVar13;
          pVVar51->outputs[uVar60].v.uData[2] = dVar14;
          pVVar51->outputs[uVar60].v.uData[3] = dVar15;
          pVVar51 = pTVar66->v1;
          pVVar51->outputs[uVar60].v.uData[0] = dVar12;
          pVVar51->outputs[uVar60].v.uData[1] = dVar13;
          pVVar51->outputs[uVar60].v.uData[2] = dVar14;
          pVVar51->outputs[uVar60].v.uData[3] = dVar15;
          pVVar51 = pTVar66->v2;
          pVVar51->outputs[uVar60].v.uData[0] = dVar12;
          pVVar51->outputs[uVar60].v.uData[1] = dVar13;
          pVVar51->outputs[uVar60].v.uData[2] = dVar14;
          pVVar51->outputs[uVar60].v.uData[3] = dVar15;
          pTVar66 = pTVar66 + 1;
        } while (pTVar66 !=
                 (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar60 = uVar60 + 1;
      pVVar69 = (pvVar53->
                super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar60 < (ulong)((long)(pvVar53->
                                    super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar69 >> 3
                             ));
  }
  clipPosX.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_021c5ef0;
  clipNegX.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_021c5f40;
  clipPosY.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_021c5f80;
  clipNegY.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_021c5fc0;
  clipPosZ.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_021c6000;
  clipNegZ.super_ClipVolumePlane._vptr_ClipVolumePlane =
       (ClipVolumePlane)&PTR_pointInClipVolume_021c6040;
  pvVar53 = &program->vertexShader->m_outputs;
  if (program->geometryShader != (GeometryShader *)0x0) {
    pvVar53 = &program->geometryShader->m_outputs;
  }
  planes[0] = &clipPosX.super_ClipVolumePlane;
  planes[1] = &clipNegX.super_ClipVolumePlane;
  planes[2] = &clipPosY.super_ClipVolumePlane;
  planes[3] = &clipNegY.super_ClipVolumePlane;
  planes[4] = &clipPosZ.super_ClipVolumePlane;
  planes[5] = &clipNegZ.super_ClipVolumePlane;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar66 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar59 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pTVar59 - (long)pTVar66) >> 5)) {
    uVar60 = (ulong)(bVar79 ^ 1) * 2 + 4;
    lVar65 = 0;
    do {
      bVar79 = true;
      local_68 = lVar65;
      uVar73 = 1;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_308._8_8_;
      local_308 = auVar11 << 0x40;
      do {
        auVar11 = local_308;
        pVVar51 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar65].v0;
        res_5.m_data = (float  [2])(double)(pVVar51->position).m_data[0];
        uStack_130 = (VertexPacket *)(double)(pVVar51->position).m_data[1];
        local_128 = (VertexPacket *)(double)(pVVar51->position).m_data[2];
        pCVar16 = planes[uVar73 - 1];
        uStack_120 = (double)(pVVar51->position).m_data[3];
        iVar40 = (**pCVar16->_vptr_ClipVolumePlane)(pCVar16,&res_5);
        pVVar51 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar65].v1;
        res_5.m_data = (float  [2])(double)(pVVar51->position).m_data[0];
        uStack_130 = (VertexPacket *)(double)(pVVar51->position).m_data[1];
        local_128 = (VertexPacket *)(double)(pVVar51->position).m_data[2];
        uStack_120 = (double)(pVVar51->position).m_data[3];
        iVar41 = (**pCVar16->_vptr_ClipVolumePlane)(pCVar16,&res_5);
        pVVar51 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar65].v2;
        res_5.m_data = (float  [2])(double)(pVVar51->position).m_data[0];
        uStack_130 = (VertexPacket *)(double)(pVVar51->position).m_data[1];
        local_128 = (VertexPacket *)(double)(pVVar51->position).m_data[2];
        uStack_120 = (double)(pVVar51->position).m_data[3];
        iVar42 = (**pCVar16->_vptr_ClipVolumePlane)(pCVar16);
        bVar52 = (byte)iVar40 | (byte)iVar41 | (byte)iVar42;
        if (bVar52 == 0) {
          local_308._1_7_ = (int7)(CONCAT44(extraout_var,iVar42) >> 8);
          local_308[0] = 1;
          local_308._8_8_ = auVar11._8_8_;
        }
        else {
          bVar75 = (byte)iVar40 & (byte)iVar41 & (byte)iVar42;
          if (bVar75 == 0) {
            bVar79 = false;
          }
          clippedByPlane[uVar73 - 1] = (bool)(bVar75 ^ 1);
        }
        bVar78 = uVar73 < uVar60;
        uVar73 = uVar73 + 1;
      } while ((bVar52 & bVar78) != 0);
      if ((local_308 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (bVar79) {
          __args = (primList->
                   super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar65;
          if (outputTriangles.
              super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              outputTriangles.
              super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>::
            _M_realloc_insert<rr::pa::Triangle_const&>
                      ((vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>> *)&outputTriangles
                       ,(iterator)
                        outputTriangles.
                        super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
                        _M_impl.super__Vector_impl_data._M_finish,__args);
          }
          else {
            pVVar51 = __args->v0;
            pVVar17 = __args->v1;
            iVar40 = __args->provokingIndex;
            uVar21 = *(undefined4 *)&__args->field_0x1c;
            (outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_finish)->v2 = __args->v2;
            (outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_finish)->provokingIndex = iVar40;
            *(undefined4 *)
             &(outputTriangles.
               super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
               super__Vector_impl_data._M_finish)->field_0x1c = uVar21;
            (outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_finish)->v0 = pVVar51;
            (outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_finish)->v1 = pVVar17;
            outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 outputTriangles.
                 super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_338 = (double *)operator_new(0xa8);
          memset(local_338,0,0xa8);
          lVar45 = 0;
          do {
            puVar5 = (undefined8 *)((long)local_338 + lVar45 + 0x10);
            *puVar5 = 0;
            puVar5[1] = 0;
            *(undefined8 *)((long)local_338 + lVar45) = 0;
            ((undefined8 *)((long)local_338 + lVar45))[1] = 0;
            lVar45 = lVar45 + 0x38;
          } while (lVar45 != 0xa8);
          pTVar66 = (primList->
                    super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl
                    .super__Vector_impl_data._M_start;
          pVVar51 = pTVar66[lVar65].v0;
          fVar81 = (pVVar51->position).m_data[1];
          fVar83 = (pVVar51->position).m_data[2];
          fVar85 = (pVVar51->position).m_data[3];
          pdVar74 = local_338 + 0x15;
          *local_338 = (double)(pVVar51->position).m_data[0];
          local_338[1] = (double)fVar81;
          local_338[2] = (double)fVar83;
          local_338[3] = (double)fVar85;
          local_338[4] = 1.0;
          local_338[5] = 0.0;
          local_338[6] = 0.0;
          pVVar51 = pTVar66[lVar65].v1;
          fVar81 = (pVVar51->position).m_data[1];
          fVar83 = (pVVar51->position).m_data[2];
          fVar85 = (pVVar51->position).m_data[3];
          local_338[7] = (double)(pVVar51->position).m_data[0];
          local_338[8] = (double)fVar81;
          local_338[9] = (double)fVar83;
          local_338[10] = (double)fVar85;
          local_338[0xb] = 0.0;
          local_338[0xc] = 1.0;
          local_268 = 0;
          local_338[0xd] = 0.0;
          pVVar51 = pTVar66[lVar65].v2;
          fVar81 = (pVVar51->position).m_data[1];
          fVar83 = (pVVar51->position).m_data[2];
          fVar85 = (pVVar51->position).m_data[3];
          local_338[0xe] = (double)(pVVar51->position).m_data[0];
          local_338[0xf] = (double)fVar81;
          local_338[0x10] = (double)fVar83;
          local_338[0x11] = (double)fVar85;
          local_338[0x12] = 0.0;
          local_338[0x13] = 0.0;
          local_338[0x14] = 1.0;
          uVar73 = 0;
          local_320 = pdVar74;
          do {
            pdVar68 = local_320;
            pdVar70 = local_338;
            if (clippedByPlane[uVar73] == true) {
              uVar80 = (int)((long)pdVar74 - (long)local_338 >> 3) * 0x3cf3cf3d;
              if ((int)uVar80 < 1) {
                local_320 = (double *)0x0;
                pdVar74 = (double *)0x0;
                local_338 = (double *)0x0;
              }
              else {
                local_1f8 = (RasterizationState *)(ulong)(uVar80 & 0x7fffffff);
                local_208._0_8_ = local_338;
                pRVar46 = (RasterizationState *)0x0;
                pdVar86 = (double *)0x0;
                pdVar74 = (double *)0x0;
                auVar31._8_8_ = 0;
                auVar31._0_8_ = local_308._8_8_;
                local_308 = auVar31 << 0x40;
                local_1e8 = uVar73;
                do {
                  convexPrimitive.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  convexPrimitive.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  convexPrimitive.
                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  pTVar77 = (TriangleVertex *)(local_338 + (long)pRVar46 * 0x15);
                  pCVar16 = planes[local_1e8];
                  local_1f0 = pRVar46;
                  iVar40 = (**pCVar16->_vptr_ClipVolumePlane)(pCVar16,pTVar77);
                  pTVar1 = pTVar77 + 1;
                  iVar41 = (**pCVar16->_vptr_ClipVolumePlane)(pCVar16);
                  pTVar2 = pTVar77 + 2;
                  iVar42 = (**pCVar16->_vptr_ClipVolumePlane)(pCVar16,pTVar2);
                  pTVar55 = convexPrimitive.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  pTVar62 = convexPrimitive.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  pTVar67 = convexPrimitive.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  bVar52 = (byte)iVar40;
                  bVar75 = (byte)iVar41;
                  iVar40 = (uint)(byte)((byte)iVar42 ^ 1) + (uint)(bVar75 ^ 1) + (uint)(bVar52 ^ 1);
                  if (iVar40 == 2) {
                    pTVar71 = pTVar1;
                    pTVar29 = pTVar2;
                    pTVar30 = pTVar77;
                    if (bVar75 != 0) {
                      pTVar71 = pTVar77;
                      pTVar29 = pTVar1;
                      pTVar30 = pTVar2;
                    }
                    if (bVar52 != 0) {
                      pTVar71 = pTVar2;
                      pTVar29 = pTVar77;
                      pTVar30 = pTVar1;
                    }
                    anon_unknown_19::cliputil::clipTriangleTwoVertices
                              (&convexPrimitive,pCVar16,pTVar29,pTVar30,pTVar71);
                  }
                  else if (iVar40 == 1) {
                    pTVar71 = pTVar77;
                    pTVar29 = pTVar1;
                    pTVar30 = pTVar2;
                    if (bVar75 != 0) {
                      pTVar71 = pTVar1;
                      pTVar29 = pTVar2;
                      pTVar30 = pTVar77;
                    }
                    if (bVar52 == 0) {
                      pTVar71 = pTVar2;
                      pTVar29 = pTVar77;
                      pTVar30 = pTVar1;
                    }
                    anon_unknown_19::cliputil::clipTriangleOneVertex
                              (&convexPrimitive,pCVar16,pTVar29,pTVar30,pTVar71);
                  }
                  else if (iVar40 == 0) {
                    pTVar1 = pTVar77 + 3;
                    uVar73 = (long)convexPrimitive.
                                   super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)convexPrimitive.
                                   super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                    uVar54 = ((long)uVar73 >> 3) * 0x6db6db6db6db6db7;
                    if ((ulong)((long)convexPrimitive.
                                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)convexPrimitive.
                                     super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish) < 0xa8) {
                      if (uVar54 + 0xfdb6db6db6db6db9 < 3) {
                        std::__throw_length_error("vector::_M_range_insert");
                      }
                      uVar73 = 3;
                      if (3 < uVar54) {
                        uVar73 = uVar54;
                      }
                      this = (_Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                              *)(uVar73 + uVar54);
                      if ((_Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                           *)0x249249249249248 < this) {
                        this = (_Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                *)0x249249249249249;
                      }
                      if (CARRY8(uVar73,uVar54)) {
                        this = (_Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                *)0x249249249249249;
                      }
                      pTVar47 = std::
                                _Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                ::_M_allocate(this,0xa8);
                      pTVar61 = pTVar47;
                      do {
                        lVar45 = 0;
                        do {
                          (pTVar61->position).m_data[lVar45] = (pTVar77->position).m_data[lVar45];
                          lVar45 = lVar45 + 1;
                        } while (lVar45 != 4);
                        pTVar61->weight[2] = pTVar77->weight[2];
                        *(undefined1 (*) [16])pTVar61->weight =
                             *(undefined1 (*) [16])pTVar77->weight;
                        pTVar77 = pTVar77 + 1;
                        pTVar61 = pTVar61 + 1;
                        pTVar32 = pTVar67;
                      } while (pTVar77 != pTVar1);
                      for (; pTVar62 != pTVar32; pTVar32 = pTVar32 + 1) {
                        lVar45 = 0;
                        do {
                          (pTVar61->position).m_data[lVar45] = (pTVar32->position).m_data[lVar45];
                          lVar45 = lVar45 + 1;
                        } while (lVar45 != 4);
                        pTVar61->weight[2] = pTVar32->weight[2];
                        *(undefined1 (*) [16])pTVar61->weight =
                             *(undefined1 (*) [16])pTVar32->weight;
                        pTVar61 = pTVar61 + 1;
                      }
                      if (pTVar67 != (pointer)0x0) {
                        operator_delete(pTVar67,(long)pTVar55 - (long)pTVar67);
                      }
                      convexPrimitive.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_start = pTVar47;
                      convexPrimitive.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish = pTVar61;
                      convexPrimitive.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar47 + (long)this;
                    }
                    else if (uVar54 < 4) {
                      if (uVar73 != 0xa8) {
                        pTVar77 = (TriangleVertex *)((long)pTVar77 + uVar73);
                        do {
                          lVar45 = 0;
                          do {
                            (pTVar62->position).m_data[lVar45] = (pTVar77->position).m_data[lVar45];
                            lVar45 = lVar45 + 1;
                          } while (lVar45 != 4);
                          pTVar62->weight[2] = pTVar77->weight[2];
                          *(undefined1 (*) [16])pTVar62->weight =
                               *(undefined1 (*) [16])pTVar77->weight;
                          pTVar77 = pTVar77 + 1;
                          pTVar62 = pTVar62 + 1;
                        } while (pTVar77 != pTVar1);
                      }
                      pTVar62 = convexPrimitive.
                                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                ._M_impl.super__Vector_impl_data._M_finish +
                                ((long)uVar73 >> 3) * -0x6db6db6db6db6db7 + 3;
                      for (; convexPrimitive.
                             super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                             ._M_impl.super__Vector_impl_data._M_finish != pTVar67;
                          pTVar67 = pTVar67 + 1) {
                        lVar45 = 0;
                        do {
                          (pTVar62->position).m_data[lVar45] = (pTVar67->position).m_data[lVar45];
                          lVar45 = lVar45 + 1;
                        } while (lVar45 != 4);
                        pTVar62->weight[2] = pTVar67->weight[2];
                        *(undefined1 (*) [16])pTVar62->weight =
                             *(undefined1 (*) [16])pTVar67->weight;
                        pTVar62 = pTVar62 + 1;
                      }
                      convexPrimitive.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)((long)(convexPrimitive.
                                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           ((long)uVar73 >> 3) * -0x6db6db6db6db6db7 + 3) + uVar73);
                      if (0 < (long)uVar73) {
                        lVar76 = uVar73 / 0x38 + 1;
                        lVar45 = 0;
                        do {
                          *(undefined8 *)
                           ((long)(convexPrimitive.
                                   super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->weight +
                           lVar45 + 0x10) = *(undefined8 *)(local_208._0_8_ + 0x30 + lVar45);
                          auVar11 = *(undefined1 (*) [16])(local_208._0_8_ + lVar45);
                          puVar6 = (undefined4 *)(local_208._0_8_ + 0x10 + lVar45);
                          uVar21 = *puVar6;
                          uVar22 = puVar6[1];
                          uVar23 = puVar6[2];
                          uVar24 = puVar6[3];
                          *(undefined1 (*) [16])
                           ((long)(convexPrimitive.
                                   super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->weight + lVar45) =
                               *(undefined1 (*) [16])(local_208._0_8_ + 0x20 + lVar45);
                          puVar6 = (undefined4 *)
                                   ((long)((convexPrimitive.
                                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->position).
                                          m_data + lVar45 + 0x10);
                          *puVar6 = uVar21;
                          puVar6[1] = uVar22;
                          puVar6[2] = uVar23;
                          puVar6[3] = uVar24;
                          *(undefined1 (*) [16])
                           ((long)((convexPrimitive.
                                    super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->position).m_data +
                           lVar45) = auVar11;
                          lVar76 = lVar76 + -1;
                          lVar45 = lVar45 + 0x38;
                        } while (1 < lVar76);
                      }
                    }
                    else {
                      pTVar67 = convexPrimitive.
                                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -3;
                      pTVar55 = convexPrimitive.
                                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      pTVar61 = pTVar67;
                      do {
                        lVar45 = 0;
                        do {
                          (pTVar55->position).m_data[lVar45] = pTVar55[-3].position.m_data[lVar45];
                          lVar45 = lVar45 + 1;
                        } while (lVar45 != 4);
                        pTVar55->weight[2] = pTVar61->weight[2];
                        CVar25 = pTVar61->weight[1];
                        pTVar55->weight[0] = pTVar61->weight[0];
                        pTVar55->weight[1] = CVar25;
                        pTVar61 = pTVar61 + 1;
                        pTVar55 = pTVar55 + 1;
                      } while (pTVar61 !=
                               convexPrimitive.
                               super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                      convexPrimitive.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           convexPrimitive.
                           super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 3;
                      uVar73 = (long)pTVar67 -
                               (long)convexPrimitive.
                                     super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      if (0 < (long)uVar73) {
                        lVar45 = uVar73 / 0x38 + 1;
                        do {
                          pTVar62[-1].weight[2] = pTVar62[-4].weight[2];
                          dVar8 = pTVar62[-4].position.m_data[0];
                          dVar9 = pTVar62[-4].position.m_data[1];
                          dVar10 = pTVar62[-4].position.m_data[2];
                          dVar26 = pTVar62[-4].position.m_data[3];
                          CVar25 = pTVar62[-4].weight[1];
                          pTVar62[-1].weight[0] = pTVar62[-4].weight[0];
                          pTVar62[-1].weight[1] = CVar25;
                          pTVar62[-1].position.m_data[2] = dVar10;
                          pTVar62[-1].position.m_data[3] = dVar26;
                          pTVar62[-1].position.m_data[0] = dVar8;
                          pTVar62[-1].position.m_data[1] = dVar9;
                          lVar45 = lVar45 + -1;
                          pTVar62 = pTVar62 + -1;
                        } while (1 < lVar45);
                      }
                      uVar73 = 4;
                      lVar45 = 0;
                      do {
                        *(undefined8 *)
                         ((long)(convexPrimitive.
                                 super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->weight + lVar45 + 0x10)
                             = *(undefined8 *)(local_208._0_8_ + 0x30 + lVar45);
                        auVar11 = *(undefined1 (*) [16])(local_208._0_8_ + lVar45);
                        puVar6 = (undefined4 *)(local_208._0_8_ + 0x10 + lVar45);
                        uVar21 = *puVar6;
                        uVar22 = puVar6[1];
                        uVar23 = puVar6[2];
                        uVar24 = puVar6[3];
                        *(undefined1 (*) [16])
                         ((long)(convexPrimitive.
                                 super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->weight + lVar45) =
                             *(undefined1 (*) [16])(local_208._0_8_ + 0x20 + lVar45);
                        puVar6 = (undefined4 *)
                                 ((long)((convexPrimitive.
                                          super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->position).
                                        m_data + lVar45 + 0x10);
                        *puVar6 = uVar21;
                        puVar6[1] = uVar22;
                        puVar6[2] = uVar23;
                        puVar6[3] = uVar24;
                        *(undefined1 (*) [16])
                         ((long)((convexPrimitive.
                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->position).m_data +
                         lVar45) = auVar11;
                        uVar73 = uVar73 - 1;
                        lVar45 = lVar45 + 0x38;
                      } while (1 < uVar73);
                    }
                  }
                  pTVar62 = convexPrimitive.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((convexPrimitive.
                       super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
                       convexPrimitive.
                       super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish) &&
                     (2 < (int)((ulong)((long)convexPrimitive.
                                              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)convexPrimitive.
                                             super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x49249249)) {
                    lVar45 = 2;
                    lVar76 = 1;
                    do {
                      pTVar67 = convexPrimitive.
                                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar76;
                      dVar8 = convexPrimitive.
                              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar76].position.m_data[3];
                      pVVar48 = &res_5;
                      res_5.m_data[1] =
                           (float)convexPrimitive.
                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar76].position.m_data
                                  [1];
                      res_5.m_data[0] =
                           (float)convexPrimitive.
                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar76].position.m_data
                                  [0];
                      res.m_data[0] = 0.0;
                      res.m_data[1] = 0.0;
                      lVar56 = 0;
                      do {
                        res.m_data[lVar56] = res_5.m_data[lVar56] / (float)dVar8;
                        lVar56 = lVar56 + 1;
                      } while (lVar56 == 1);
                      fVar83 = (float)(pTVar62->position).m_data[0];
                      fVar85 = (float)(pTVar62->position).m_data[1];
                      fVar81 = (float)(pTVar62->position).m_data[3];
                      res_5.m_data[1] = fVar85;
                      res_5.m_data[0] = fVar83;
                      res_1.m_data[0] = 0.0;
                      res_1.m_data[1] = 0.0;
                      lVar56 = 0;
                      do {
                        res_1.m_data[lVar56] = res_5.m_data[lVar56] / fVar81;
                        lVar56 = lVar56 + 1;
                      } while (lVar56 == 1);
                      res_2.m_data[0] = 0.0;
                      res_2.m_data[1] = 0.0;
                      lVar56 = 0;
                      do {
                        res_2.m_data[lVar56] = res.m_data[lVar56] - res_1.m_data[lVar56];
                        lVar56 = lVar56 + 1;
                      } while (lVar56 == 1);
                      pTVar55 = convexPrimitive.
                                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar45;
                      dVar8 = convexPrimitive.
                              super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar45].position.m_data[3];
                      res_5.m_data[1] =
                           (float)convexPrimitive.
                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar45].position.m_data
                                  [1];
                      res_5.m_data[0] =
                           (float)convexPrimitive.
                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar45].position.m_data
                                  [0];
                      res_3.m_data[0] = 0.0;
                      res_3.m_data[1] = 0.0;
                      lVar56 = 0;
                      do {
                        res_3.m_data[lVar56] = res_5.m_data[lVar56] / (float)dVar8;
                        lVar56 = lVar56 + 1;
                      } while (lVar56 == 1);
                      res_5.m_data[1] = fVar85;
                      res_5.m_data[0] = fVar83;
                      res_4.m_data[0] = 0.0;
                      res_4.m_data[1] = 0.0;
                      lVar56 = 0;
                      do {
                        res_4.m_data[lVar56] = res_5.m_data[lVar56] / fVar81;
                        lVar56 = lVar56 + 1;
                      } while (lVar56 == 1);
                      res_5.m_data[0] = 0.0;
                      res_5.m_data[1] = 0.0;
                      lVar56 = 0;
                      do {
                        res_5.m_data[lVar56] = res_3.m_data[lVar56] - res_4.m_data[lVar56];
                        lVar56 = lVar56 + 1;
                      } while (lVar56 == 1);
                      fVar83 = res_2.m_data[0] * res_5.m_data[1] - res_2.m_data[1] * res_5.m_data[0]
                      ;
                      fVar81 = -fVar83;
                      if (-fVar83 <= fVar83) {
                        fVar81 = fVar83;
                      }
                      if (1e-06 <= fVar81) {
                        lVar56 = 0;
                        do {
                          *(undefined8 *)((long)&local_128 + lVar56) = 0;
                          *(undefined8 *)((long)&uStack_120 + lVar56) = 0;
                          *(undefined8 *)((long)res_5.m_data + lVar56) = 0;
                          *(undefined8 *)((long)&uStack_130 + lVar56) = 0;
                          lVar56 = lVar56 + 0x38;
                        } while (lVar56 != 0xa8);
                        local_108 = pTVar62->weight[2];
                        local_118 = (void *)pTVar62->weight[0];
                        CStack_110 = pTVar62->weight[1];
                        local_128 = (VertexPacket *)(pTVar62->position).m_data[2];
                        uStack_120 = (pTVar62->position).m_data[3];
                        res_5.m_data = (float  [2])(pTVar62->position).m_data[0];
                        uStack_130 = (VertexPacket *)(pTVar62->position).m_data[1];
                        local_d0 = pTVar67->weight[2];
                        local_e0 = pTVar67->weight[0];
                        CStack_d8 = pTVar67->weight[1];
                        local_f0 = (pTVar67->position).m_data[2];
                        dStack_e8 = (pTVar67->position).m_data[3];
                        local_100 = (pTVar67->position).m_data[0];
                        dStack_f8 = (pTVar67->position).m_data[1];
                        local_98 = pTVar55->weight[2];
                        local_a8 = *(undefined1 (*) [16])pTVar55->weight;
                        local_b8 = *(undefined4 *)((pTVar55->position).m_data + 2);
                        uStack_b4 = *(undefined4 *)((long)(pTVar55->position).m_data + 0x14);
                        uStack_b0 = *(undefined4 *)((pTVar55->position).m_data + 3);
                        uStack_ac = *(undefined4 *)((long)(pTVar55->position).m_data + 0x1c);
                        local_c8 = (pTVar55->position).m_data[0];
                        dStack_c0 = (pTVar55->position).m_data[1];
                        if (pdVar74 == (double *)local_308._0_8_) {
                          lVar56 = (long)pdVar74 - (long)pdVar86;
                          if (lVar56 == 0x7ffffffffffffff8) {
                            std::__throw_length_error("vector::_M_realloc_insert");
                          }
                          lVar72 = lVar56 >> 3;
                          uVar54 = lVar72 * -0x30c30c30c30c30c3;
                          uVar73 = uVar54;
                          if (pdVar74 == pdVar86) {
                            uVar73 = 1;
                          }
                          uVar63 = uVar73 + uVar54;
                          if (0xc30c30c30c30c2 < uVar63) {
                            uVar63 = 0xc30c30c30c30c3;
                          }
                          if (CARRY8(uVar73,uVar54)) {
                            uVar63 = 0xc30c30c30c30c3;
                          }
                          if (uVar63 == 0) {
                            pdVar49 = (double *)0x0;
                          }
                          else {
                            pdVar49 = (double *)operator_new(uVar63 * 0xa8);
                          }
                          lVar57 = 0;
                          do {
                            uVar27 = *(undefined8 *)((long)res_5.m_data + lVar57);
                            uVar28 = *(undefined8 *)((long)&uStack_130 + lVar57);
                            uVar21 = *(undefined4 *)((long)&local_128 + lVar57 + 4);
                            uVar22 = *(undefined4 *)((long)&uStack_120 + lVar57);
                            uVar23 = *(undefined4 *)((long)&uStack_120 + lVar57 + 4);
                            puVar6 = (undefined4 *)((long)pdVar49 + lVar57 + lVar56 + 0x10);
                            *puVar6 = *(undefined4 *)((long)&local_128 + lVar57);
                            puVar6[1] = uVar21;
                            puVar6[2] = uVar22;
                            puVar6[3] = uVar23;
                            puVar5 = (undefined8 *)((long)pdVar49 + lVar57 + lVar56);
                            *puVar5 = uVar27;
                            puVar5[1] = uVar28;
                            *(undefined8 *)((long)pdVar49 + lVar57 + lVar72 * 8 + 0x30) =
                                 *(undefined8 *)((long)&local_108 + lVar57);
                            *(undefined1 (*) [16])((long)pdVar49 + lVar57 + lVar72 * 8 + 0x20) =
                                 *(undefined1 (*) [16])((long)&local_118 + lVar57);
                            lVar57 = lVar57 + 0x38;
                            pdVar33 = pdVar49;
                            pdVar34 = pdVar86;
                          } while (lVar57 != 0xa8);
                          for (; pdVar74 != pdVar34; pdVar34 = pdVar34 + 0x15) {
                            lVar56 = 0;
                            pdVar58 = pdVar34;
                            pdVar64 = pdVar33;
                            do {
                              lVar72 = 0;
                              do {
                                pdVar64[lVar72] = pdVar58[lVar72];
                                lVar72 = lVar72 + 1;
                              } while (lVar72 != 4);
                              pdVar33[lVar56 * 7 + 6] = pdVar34[lVar56 * 7 + 6];
                              *(undefined1 (*) [16])(pdVar33 + lVar56 * 7 + 4) =
                                   *(undefined1 (*) [16])(pdVar34 + lVar56 * 7 + 4);
                              lVar56 = lVar56 + 1;
                              pdVar64 = pdVar64 + 7;
                              pdVar58 = pdVar58 + 7;
                            } while (lVar56 != 3);
                            pdVar33 = pdVar33 + 0x15;
                          }
                          if (pdVar86 != (double *)0x0) {
                            operator_delete(pdVar86,local_308._0_8_ - (long)pdVar86);
                          }
                          local_308._0_8_ = pdVar49 + uVar63 * 0x15;
                          pdVar74 = pdVar33;
                          pdVar86 = pdVar49;
                        }
                        else {
                          lVar56 = 0;
                          pdVar49 = pdVar74;
                          do {
                            lVar72 = 0;
                            do {
                              pdVar49[lVar72] = *(double *)pVVar48[lVar72].m_data;
                              lVar72 = lVar72 + 1;
                            } while (lVar72 != 4);
                            pdVar74[lVar56 * 7 + 6] = (&local_108)[lVar56 * 7];
                            *(undefined1 (*) [16])(pdVar74 + lVar56 * 7 + 4) =
                                 *(undefined1 (*) [16])(&local_118 + lVar56 * 7);
                            lVar56 = lVar56 + 1;
                            pdVar49 = pdVar49 + 7;
                            pVVar48 = pVVar48 + 7;
                          } while (lVar56 != 3);
                        }
                        pdVar74 = pdVar74 + 0x15;
                      }
                      lVar45 = lVar45 + 1;
                      lVar76 = lVar76 + 1;
                    } while (lVar45 < (int)((ulong)((long)convexPrimitive.
                                                                                                                    
                                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)convexPrimitive.
                                                                                                                
                                                  super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                      -0x49249249);
                  }
                  if (convexPrimitive.
                      super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(convexPrimitive.
                                    super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)convexPrimitive.
                                          super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)convexPrimitive.
                                          super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  pRVar46 = (RasterizationState *)((long)&local_1f0->winding + 1);
                  local_208._0_8_ = local_208._0_8_ + 0xa8;
                } while (pRVar46 != local_1f8);
                local_320 = (double *)local_308._0_8_;
                uVar73 = local_1e8;
                local_338 = pdVar86;
              }
            }
            else {
              pdVar68 = (double *)0x0;
              pdVar70 = (double *)0x0;
            }
            if (pdVar70 != (double *)0x0) {
              operator_delete(pdVar70,(long)pdVar68 - (long)pdVar70);
            }
            uVar73 = uVar73 + 1;
          } while (uVar73 != uVar60);
          uVar80 = (int)((long)pdVar74 - (long)local_338 >> 3) * 0x3cf3cf3d;
          if (0 < (int)uVar80) {
            do {
              afVar50 = (float  [2])VertexPacketAllocator::alloc(vpalloc);
              pVVar51 = VertexPacketAllocator::alloc(vpalloc);
              local_128 = VertexPacketAllocator::alloc(vpalloc);
              res_5.m_data[0] = afVar50[0];
              res_5.m_data[1] = afVar50[1];
              uStack_130 = pVVar51;
              uStack_120 = (double)CONCAT44(uStack_120._4_4_,0xffffffff);
              dVar8 = local_338[local_268 * 0x15 + 1];
              dVar9 = local_338[local_268 * 0x15 + 2];
              dVar10 = local_338[local_268 * 0x15 + 3];
              ((Vec4 *)((long)afVar50 + 8))->m_data[0] = (float)local_338[local_268 * 0x15];
              *(float *)((long)afVar50 + 0xc) = (float)dVar8;
              *(float *)((long)afVar50 + 0x10) = (float)dVar9;
              *(float *)((long)afVar50 + 0x14) = (float)dVar10;
              dVar8 = local_338[local_268 * 0x15 + 8];
              dVar9 = local_338[local_268 * 0x15 + 9];
              dVar10 = local_338[local_268 * 0x15 + 10];
              (pVVar51->position).m_data[0] = (float)local_338[local_268 * 0x15 + 7];
              (pVVar51->position).m_data[1] = (float)dVar8;
              (pVVar51->position).m_data[2] = (float)dVar9;
              (pVVar51->position).m_data[3] = (float)dVar10;
              dVar8 = local_338[local_268 * 0x15 + 0xf];
              dVar9 = local_338[local_268 * 0x15 + 0x10];
              dVar10 = local_338[local_268 * 0x15 + 0x11];
              (local_128->position).m_data[0] = (float)local_338[local_268 * 0x15 + 0xe];
              (local_128->position).m_data[1] = (float)dVar8;
              (local_128->position).m_data[2] = (float)dVar9;
              (local_128->position).m_data[3] = (float)dVar10;
              pVVar69 = (pvVar53->
                        super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((pvVar53->
                  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>)
                  ._M_impl.super__Vector_impl_data._M_finish != pVVar69) {
                uVar73 = 0;
                do {
                  if (pVVar69[uVar73].type == GENERICVECTYPE_FLOAT) {
                    pTVar66 = (primList->
                              super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    lVar45 = uVar73 * 0x10;
                    pGVar7 = (pTVar66[lVar65].v0)->outputs + uVar73;
                    convexPrimitive.
                    super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&pGVar7->v;
                    convexPrimitive.
                    super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)((long)&pGVar7->v + 8);
                    pGVar7 = (pTVar66[lVar65].v1)->outputs + uVar73;
                    pGStack_230 = *(pointer *)((long)&pGVar7->v + 8);
                    res_2.m_data = *(float (*) [2])&pGVar7->v;
                    pGVar7 = (pTVar66[lVar65].v2)->outputs + uVar73;
                    pFStack_248 = *(pointer *)((long)&pGVar7->v + 8);
                    res.m_data = *(float (*) [2])&pGVar7->v;
                    dVar8 = local_338[local_268 * 0x15 + 4];
                    res_4.m_data[0] = 0.0;
                    res_4.m_data[1] = 0.0;
                    lVar76 = 0;
                    do {
                      res_4.m_data[lVar76] =
                           *(float *)((long)&convexPrimitive.
                                             super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar76 * 4)
                           * (float)dVar8;
                      lVar76 = lVar76 + 1;
                    } while (lVar76 != 4);
                    dVar8 = local_338[local_268 * 0x15 + 5];
                    format.order = R;
                    format.type = SNORM_INT8;
                    lVar76 = 0;
                    do {
                      (&format.order)[lVar76] = (ChannelOrder)(res_2.m_data[lVar76] * (float)dVar8);
                      lVar76 = lVar76 + 1;
                    } while (lVar76 != 4);
                    res_3.m_data[0] = 0.0;
                    res_3.m_data[1] = 0.0;
                    lVar76 = 0;
                    do {
                      res_3.m_data[lVar76] = res_4.m_data[lVar76] + (float)(&format.order)[lVar76];
                      lVar76 = lVar76 + 1;
                    } while (lVar76 != 4);
                    dVar8 = local_338[local_268 * 0x15 + 6];
                    local_218[0] = 0.0;
                    local_218[1] = 0.0;
                    local_218[2] = 0.0;
                    local_218[3] = 0.0;
                    lVar76 = 0;
                    do {
                      local_218[lVar76] = res.m_data[lVar76] * (float)dVar8;
                      lVar76 = lVar76 + 1;
                    } while (lVar76 != 4);
                    res_1.m_data[0] = 0.0;
                    res_1.m_data[1] = 0.0;
                    lVar76 = 0;
                    do {
                      res_1.m_data[lVar76] = res_3.m_data[lVar76] + local_218[lVar76];
                      lVar76 = lVar76 + 1;
                    } while (lVar76 != 4);
                    ((GenericVec4 *)((long)afVar50 + 0x20))[uVar73].v.fData[0] = res_1.m_data[0];
                    *(float *)((undefined1 *)((long)afVar50 + 0x24) + lVar45) = res_1.m_data[1];
                    *(undefined4 *)((undefined1 *)((long)afVar50 + 0x28) + lVar45) = 0;
                    *(undefined4 *)((undefined1 *)((long)afVar50 + 0x2c) + lVar45) = 0;
                    dVar8 = local_338[local_268 * 0x15 + 0xb];
                    res_4.m_data[0] = 0.0;
                    res_4.m_data[1] = 0.0;
                    lVar45 = 0;
                    do {
                      res_4.m_data[lVar45] =
                           *(float *)((long)&convexPrimitive.
                                             super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar45 * 4)
                           * (float)dVar8;
                      lVar45 = lVar45 + 1;
                    } while (lVar45 != 4);
                    dVar8 = local_338[local_268 * 0x15 + 0xc];
                    format.order = R;
                    format.type = SNORM_INT8;
                    lVar45 = 0;
                    do {
                      (&format.order)[lVar45] = (ChannelOrder)(res_2.m_data[lVar45] * (float)dVar8);
                      lVar45 = lVar45 + 1;
                    } while (lVar45 != 4);
                    res_3.m_data[0] = 0.0;
                    res_3.m_data[1] = 0.0;
                    lVar45 = 0;
                    do {
                      res_3.m_data[lVar45] = res_4.m_data[lVar45] + (float)(&format.order)[lVar45];
                      lVar45 = lVar45 + 1;
                    } while (lVar45 != 4);
                    dVar8 = local_338[local_268 * 0x15 + 0xd];
                    local_218[0] = 0.0;
                    local_218[1] = 0.0;
                    local_218[2] = 0.0;
                    local_218[3] = 0.0;
                    lVar45 = 0;
                    do {
                      local_218[lVar45] = res.m_data[lVar45] * (float)dVar8;
                      lVar45 = lVar45 + 1;
                    } while (lVar45 != 4);
                    res_1.m_data[0] = 0.0;
                    res_1.m_data[1] = 0.0;
                    lVar45 = 0;
                    do {
                      res_1.m_data[lVar45] = res_3.m_data[lVar45] + local_218[lVar45];
                      lVar45 = lVar45 + 1;
                    } while (lVar45 != 4);
                    pVVar51->outputs[uVar73].v.fData[0] = res_1.m_data[0];
                    pVVar51->outputs[uVar73].v.fData[1] = res_1.m_data[1];
                    pVVar51->outputs[uVar73].v.uData[2] = 0;
                    pVVar51->outputs[uVar73].v.uData[3] = 0;
                    dVar8 = local_338[local_268 * 0x15 + 0x12];
                    res_4.m_data[0] = 0.0;
                    res_4.m_data[1] = 0.0;
                    lVar45 = 0;
                    do {
                      res_4.m_data[lVar45] =
                           *(float *)((long)&convexPrimitive.
                                             super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar45 * 4)
                           * (float)dVar8;
                      lVar45 = lVar45 + 1;
                    } while (lVar45 != 4);
                    dVar8 = local_338[local_268 * 0x15 + 0x13];
                    format.order = R;
                    format.type = SNORM_INT8;
                    lVar45 = 0;
                    do {
                      (&format.order)[lVar45] = (ChannelOrder)(res_2.m_data[lVar45] * (float)dVar8);
                      lVar45 = lVar45 + 1;
                    } while (lVar45 != 4);
                    res_3.m_data[0] = 0.0;
                    res_3.m_data[1] = 0.0;
                    lVar45 = 0;
                    do {
                      res_3.m_data[lVar45] = res_4.m_data[lVar45] + (float)(&format.order)[lVar45];
                      lVar45 = lVar45 + 1;
                    } while (lVar45 != 4);
                    dVar8 = local_338[local_268 * 0x15 + 0x14];
                    local_218[0] = 0.0;
                    local_218[1] = 0.0;
                    local_218[2] = 0.0;
                    local_218[3] = 0.0;
                    lVar45 = 0;
                    do {
                      local_218[lVar45] = res.m_data[lVar45] * (float)dVar8;
                      lVar45 = lVar45 + 1;
                    } while (lVar45 != 4);
                    res_1.m_data[0] = 0.0;
                    res_1.m_data[1] = 0.0;
                    lVar45 = 0;
                    do {
                      res_1.m_data[lVar45] = res_3.m_data[lVar45] + local_218[lVar45];
                      lVar45 = lVar45 + 1;
                    } while (lVar45 != 4);
                    local_128->outputs[uVar73].v.fData[0] = res_1.m_data[0];
                    local_128->outputs[uVar73].v.fData[1] = res_1.m_data[1];
                    local_128->outputs[uVar73].v.uData[2] = 0;
                    local_128->outputs[uVar73].v.uData[3] = 0;
                  }
                  else {
                    pTVar66 = (primList->
                              super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    iVar40 = pTVar66[lVar65].provokingIndex;
                    pTVar66 = pTVar66 + lVar65;
                    if (iVar40 != 0) {
                      if (iVar40 == 2) {
                        pTVar66 = (pointer)&pTVar66->v2;
                      }
                      else {
                        pTVar66 = (pointer)&pTVar66->v1;
                      }
                    }
                    pVVar17 = pTVar66->v0;
                    lVar45 = uVar73 * 0x10;
                    ((GenericVec4 *)((long)afVar50 + 0x20))[uVar73].v.uData[0] =
                         pVVar17->outputs[uVar73].v.uData[0];
                    *(deUint32 *)((undefined1 *)((long)afVar50 + 0x24) + lVar45) =
                         pVVar17->outputs[uVar73].v.uData[1];
                    *(deUint32 *)((undefined1 *)((long)afVar50 + 0x28) + lVar45) =
                         pVVar17->outputs[uVar73].v.uData[2];
                    *(deUint32 *)((undefined1 *)((long)afVar50 + 0x2c) + lVar45) =
                         pVVar17->outputs[uVar73].v.uData[3];
                    pTVar66 = (primList->
                              super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    iVar40 = pTVar66[lVar65].provokingIndex;
                    pTVar66 = pTVar66 + lVar65;
                    if (iVar40 != 0) {
                      if (iVar40 == 2) {
                        pTVar66 = (pointer)&pTVar66->v2;
                      }
                      else {
                        pTVar66 = (pointer)&pTVar66->v1;
                      }
                    }
                    pVVar17 = pTVar66->v0;
                    pVVar51->outputs[uVar73].v.uData[0] = pVVar17->outputs[uVar73].v.uData[0];
                    pVVar51->outputs[uVar73].v.uData[1] = pVVar17->outputs[uVar73].v.uData[1];
                    pVVar51->outputs[uVar73].v.uData[2] = pVVar17->outputs[uVar73].v.uData[2];
                    pVVar51->outputs[uVar73].v.uData[3] = pVVar17->outputs[uVar73].v.uData[3];
                    pTVar66 = (primList->
                              super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    iVar40 = pTVar66[lVar65].provokingIndex;
                    pTVar66 = pTVar66 + lVar65;
                    if (iVar40 != 0) {
                      if (iVar40 == 2) {
                        pTVar66 = (pointer)&pTVar66->v2;
                      }
                      else {
                        pTVar66 = (pointer)&pTVar66->v1;
                      }
                    }
                    pVVar17 = pTVar66->v0;
                    local_128->outputs[uVar73].v.uData[0] = pVVar17->outputs[uVar73].v.uData[0];
                    local_128->outputs[uVar73].v.uData[1] = pVVar17->outputs[uVar73].v.uData[1];
                    local_128->outputs[uVar73].v.uData[2] = pVVar17->outputs[uVar73].v.uData[2];
                    local_128->outputs[uVar73].v.uData[3] = pVVar17->outputs[uVar73].v.uData[3];
                  }
                  uVar73 = uVar73 + 1;
                  pVVar69 = (pvVar53->
                            super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                } while (uVar73 < (ulong)((long)(pvVar53->
                                                super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pVVar69 >> 3));
              }
              if (outputTriangles.
                  super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  outputTriangles.
                  super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>::
                _M_realloc_insert<rr::pa::Triangle_const&>
                          ((vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>> *)
                           &outputTriangles,
                           (iterator)
                           outputTriangles.
                           super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(Triangle *)&res_5);
              }
              else {
                (outputTriangles.
                 super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                 super__Vector_impl_data._M_finish)->v2 = local_128;
                *(double *)
                 &(outputTriangles.
                   super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                   super__Vector_impl_data._M_finish)->provokingIndex = uStack_120;
                (outputTriangles.
                 super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                 super__Vector_impl_data._M_finish)->v0 = (VertexPacket *)afVar50;
                (outputTriangles.
                 super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                 super__Vector_impl_data._M_finish)->v1 = pVVar51;
                outputTriangles.
                super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     outputTriangles.
                     super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl
                     .super__Vector_impl_data._M_finish + 1;
              }
              local_268 = local_268 + 1;
            } while (local_268 != (uVar80 & 0x7fffffff));
          }
          if (local_338 != (double *)0x0) {
            operator_delete(local_338,(long)local_320 - (long)local_338);
          }
        }
      }
      lVar65 = local_68 + 1;
      pTVar66 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar59 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    } while (lVar65 < (int)((ulong)((long)pTVar59 - (long)pTVar66) >> 5));
  }
  pTVar18 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
  super__Vector_impl_data._M_start =
       outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = pTVar66;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar59;
  outputTriangles.super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pTVar18;
  if (pTVar66 != (pointer)0x0) {
    operator_delete(pTVar66,(long)pTVar18 - (long)pTVar66);
  }
  pTVar66 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (pTVar66 !=
      (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pTVar66->v0);
      anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pTVar66->v1);
      anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pTVar66->v2);
      pTVar66 = pTVar66 + 1;
    } while (pTVar66 !=
             (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  uVar60 = (ulong)*(int *)&renderTarget->field_0x8;
  pFVar19 = (program->fragmentShader->m_outputs).
            super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pFVar20 = (program->fragmentShader->m_outputs).
            super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  fVar81 = (float)(state->viewport).rect.left;
  fVar83 = (float)(state->viewport).rect.bottom;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&res_5,
             (MultisamplePixelBufferAccess *)renderTarget);
  if ((int)fVar81 < 1) {
    fVar81 = 0.0;
  }
  if ((int)fVar83 < 1) {
    fVar83 = 0.0;
  }
  res_4.m_data[1] = fVar83;
  res_4.m_data[0] = fVar81;
  fragmentPackets = (FragmentPacket *)operator_new(0x2000);
  pFVar4 = fragmentPackets + 0x80;
  memset(fragmentPackets,0,0x2000);
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::vector
            ((vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)&res_2,
             ((long)pFVar19 - (long)pFVar20) * 0x40000000 >> 0x17,(allocator_type *)&res_5);
  std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::vector
            ((vector<rr::Fragment,_std::allocator<rr::Fragment>_> *)&res,0x200,
             (allocator_type *)&res_5);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  local_1a8.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  planes[4] = (ClipVolumePlane *)0x0;
  planes[5] = (ClipVolumePlane *)0x0;
  planes[2] = (ClipVolumePlane *)0x0;
  planes[3] = (ClipVolumePlane *)0x0;
  planes[0] = (ClipVolumePlane *)0x0;
  planes[1] = (ClipVolumePlane *)0x0;
  local_1f8 = (RasterizationState *)&renderTarget->m_depthBuffer;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&res_5,(MultisamplePixelBufferAccess *)local_1f8);
  if ((((int)uStack_130 == 0) || (uStack_130._4_4_ == 0)) || ((int)local_128 == 0)) {
    fragmentDepths_.m_data[0] = 0.0;
    fragmentDepths_.m_data[1] = 0.0;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&res_1,uVar60 << 9);
    fragmentDepths_ = res_1;
  }
  pFVar39 = local_1a8.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar38 = planes[3];
  pCVar37 = planes[2];
  pCVar16 = planes[0];
  outputArray_.m_data = res_2.m_data;
  VVar36.m_data = res.m_data;
  planes[3] = (ClipVolumePlane *)res_2.m_data;
  planes[4] = (ClipVolumePlane *)pGStack_230;
  res_2.m_data = (float  [2])pCVar38;
  local_1a8.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)res.m_data;
  local_1a8.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_finish = pFStack_248;
  res.m_data = (float  [2])pFVar39;
  pTVar66 = (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  planes[0] = (ClipVolumePlane *)fragmentPackets;
  planes[1] = (ClipVolumePlane *)pFVar4;
  planes[2] = (ClipVolumePlane *)pFVar4;
  local_190 = fragmentDepths_.m_data;
  if (pTVar66 !=
      (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1f0 = &state->rasterization;
    do {
      iVar40 = *(int *)&renderTarget->field_0x8;
      local_208 = ZEXT416((uint)(state->viewport).zn);
      fVar81 = (state->viewport).zf;
      TriangleRasterizer::TriangleRasterizer
                ((TriangleRasterizer *)&res_5,(IVec4 *)&res_4,iVar40,local_1f0);
      TriangleRasterizer::init((TriangleRasterizer *)&res_5,(EVP_PKEY_CTX *)&pTVar66->v0->position);
      facetype = local_88;
      if ((state->cullMode != CULLMODE_FRONT || local_88 != FACETYPE_FRONT) &&
         (local_88 != FACETYPE_BACK || state->cullMode != CULLMODE_BACK)) {
        FragmentShadingContext::FragmentShadingContext
                  ((FragmentShadingContext *)&outputTriangles,pTVar66->v0->outputs,
                   pTVar66->v1->outputs,pTVar66->v2->outputs,(GenericVec4 *)outputArray_.m_data,
                   (float *)fragmentDepths_.m_data,
                   (int)((ulong)((long)(program->fragmentShader->m_outputs).
                                       super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(program->fragmentShader->m_outputs).
                                      super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),iVar40,
                   local_88,(FaceType)uVar60);
        fVar83 = 0.0;
        if ((fragmentDepths_.m_data != (float  [2])0x0) &&
           ((state->fragOps).polygonOffsetEnabled == true)) {
          p = &pTVar66->v0->position;
          v0 = &pTVar66->v1->position;
          v1 = &pTVar66->v2->position;
          fVar82 = anon_unknown_19::findTriangleVertexDepthSlope(p,v0,v1);
          fVar83 = anon_unknown_19::findTriangleVertexDepthSlope(v0,v1,p);
          local_1e8 = CONCAT44(extraout_XMM0_Db,fVar83);
          fVar84 = anon_unknown_19::findTriangleVertexDepthSlope(v1,p,v0);
          MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                    ((MultisampleConstPixelBufferAccess *)&convexPrimitive,
                     (MultisamplePixelBufferAccess *)local_1f8);
          fVar83 = (pTVar66->v0->position).m_data[2];
          fVar85 = (pTVar66->v1->position).m_data[2];
          uVar80 = -(uint)(fVar85 <= fVar83);
          fVar85 = (float)(~uVar80 & (uint)fVar85 | (uint)fVar83 & uVar80);
          fVar83 = (pTVar66->v2->position).m_data[2];
          uVar80 = -(uint)(fVar83 <= fVar85);
          uVar80 = ~uVar80 & (uint)fVar83 | uVar80 & (uint)fVar85;
          format = (TextureFormat)
                   convexPrimitive.
                   super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          TVar35 = format;
          fVar83 = 0.0;
          format.type = (ChannelType)
                        ((ulong)convexPrimitive.
                                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 0x20);
          channelType = format.type;
          format = TVar35;
          if ((int)convexPrimitive.
                   super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0x14) {
            fVar85 = (float)local_1e8;
            if (format.type == UNSIGNED_INT_24_8) {
              fVar83 = 5.9604645e-08;
            }
            else {
              bVar79 = format.type == FLOAT_UNSIGNED_INT_24_8_REV;
              if (bVar79) {
LAB_01998ec3:
                uVar44 = uVar80 & 0x7f800000;
                fVar3 = (float)(uVar44 + 0xf4800000);
                fVar83 = -1.6225928e+32;
                if ((uVar80 & 0x7fffff) == 0) {
                  fVar83 = fVar3;
                }
                fVar85 = (float)local_1e8;
                if (uVar44 != 0) {
                  fVar83 = fVar3;
                }
              }
            }
          }
          else {
            if ((int)convexPrimitive.
                     super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x12) {
              TVar43 = tcu::getTextureChannelClass(channelType);
              tcu::getTextureFormatBitDepth((tcu *)&res_3,&format);
              if (TVar43 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                fVar85 = (float)local_1e8;
                fVar83 = 0.0;
                if (channelType == FLOAT) goto LAB_01998ec3;
                goto LAB_01998f1d;
              }
              fVar83 = (float)((int)res_3.m_data[0] * -0x800000 + 0x3f800000);
            }
            fVar85 = (float)local_1e8;
          }
LAB_01998f1d:
          fVar85 = (float)(~-(uint)(fVar84 <= fVar85) & (uint)fVar84 |
                          (uint)fVar85 & -(uint)(fVar84 <= fVar85));
          uVar80 = -(uint)(fVar85 <= fVar82);
          fVar83 = (float)(uVar80 & (uint)fVar82 | ~uVar80 & (uint)fVar85) *
                   (state->fragOps).polygonOffsetFactor +
                   fVar83 * (state->fragOps).polygonOffsetUnits;
        }
        uVar60 = (ulong)(uint)fVar83;
        fVar85 = (float)(~-(uint)((float)local_208._0_4_ <= fVar81) & (uint)fVar81 |
                        -(uint)((float)local_208._0_4_ <= fVar81) & local_208._0_4_);
        local_208 = ZEXT416(~-(uint)(fVar81 <= (float)local_208._0_4_) & (uint)fVar81 |
                            local_208._0_4_ & -(uint)(fVar81 <= (float)local_208._0_4_));
        while( true ) {
          convexPrimitive.
          super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)convexPrimitive.
                                super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          TriangleRasterizer::rasterize
                    ((TriangleRasterizer *)&res_5,fragmentPackets,(float *)fragmentDepths_.m_data,
                     0x80,(int *)&convexPrimitive);
          if ((int)convexPrimitive.
                   super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0) break;
          if (((fragmentDepths_.m_data != (float  [2])0x0) &&
              ((state->fragOps).polygonOffsetEnabled == true)) &&
             (uVar80 = (int)convexPrimitive.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ._M_impl.super__Vector_impl_data._M_start * iVar40 * 4, 0 < (int)uVar80)
             ) {
            uVar73 = 0;
            do {
              fVar82 = *(float *)((long)fragmentDepths_.m_data + uVar73 * 4) + fVar83;
              fVar81 = 1.0;
              if (fVar82 <= 1.0) {
                fVar81 = fVar82;
              }
              *(uint *)((long)fragmentDepths_.m_data + uVar73 * 4) =
                   ~-(uint)(fVar82 < 0.0) & (uint)fVar81;
              uVar73 = uVar73 + 1;
            } while (uVar80 != uVar73);
          }
          (**program->fragmentShader->_vptr_FragmentShader)(program->fragmentShader,fragmentPackets)
          ;
          if (((fragmentDepths_.m_data != (float  [2])0x0) &&
              ((state->fragOps).depthClampEnabled == true)) &&
             (uVar80 = (int)convexPrimitive.
                            super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                            ._M_impl.super__Vector_impl_data._M_start * iVar40 * 4, 0 < (int)uVar80)
             ) {
            uVar73 = 0;
            do {
              fVar81 = *(float *)((long)fragmentDepths_.m_data + uVar73 * 4);
              fVar82 = (float)local_208._0_4_;
              if (fVar81 <= (float)local_208._0_4_) {
                fVar82 = fVar81;
              }
              uVar44 = -(uint)(fVar81 < fVar85);
              *(uint *)((long)fragmentDepths_.m_data + uVar73 * 4) =
                   uVar44 & (uint)fVar85 | ~uVar44 & (uint)fVar82;
              uVar73 = uVar73 + 1;
            } while (uVar80 != uVar73);
          }
          anon_unknown_19::writeFragmentPackets
                    (state,renderTarget,program,fragmentPackets,
                     (int)convexPrimitive.
                          super__Vector_base<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start,facetype,
                     (vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)(planes + 3),
                     (float *)fragmentDepths_.m_data,&local_1a8);
        }
      }
      pTVar66 = pTVar66 + 1;
    } while (pTVar66 !=
             (primList->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (VVar36.m_data != (float  [2])0x0) {
    operator_delete((void *)VVar36.m_data,(long)local_240 - (long)VVar36.m_data);
  }
  if (outputArray_.m_data != (float  [2])0x0) {
    operator_delete((void *)outputArray_.m_data,(long)pGStack_228 - (long)outputArray_.m_data);
  }
  operator_delete(fragmentPackets,0x2000);
  if (res_1.m_data != (float  [2])0x0) {
    operator_delete((void *)res_1.m_data,-(long)res_1.m_data);
  }
  if (res.m_data != (float  [2])0x0) {
    operator_delete((void *)res.m_data,
                    (long)local_1a8.super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage - (long)res.m_data);
  }
  if (res_2.m_data != (float  [2])0x0) {
    operator_delete((void *)res_2.m_data,(long)planes[5] - (long)res_2.m_data);
  }
  if (pCVar16 != (ClipVolumePlane *)0x0) {
    operator_delete(pCVar16,(long)pCVar37 - (long)pCVar16);
  }
  return;
}

Assistant:

void drawBasicPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, ContainerType& primList, VertexPacketAllocator& vpalloc)
{
	const bool clipZ = !state.fragOps.depthClampEnabled;

	// Transform feedback

	// Flatshading
	flatshadeVertices(program, primList);

	// Clipping
	// \todo [jarkko] is creating & swapping std::vectors really a good solution?
	clipPrimitives(primList, program, clipZ, vpalloc);

	// Transform vertices to window coords
	transformClipCoordsToWindowCoords(state, primList);

	// Rasterize and paint
	rasterize(state, renderTarget, program, primList);
}